

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::GetTypedModeFunction<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  LogicalType *in_RCX;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,(LogicalType *)this);
  LogicalType::LogicalType(&local_40,(LogicalType *)this);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,in_RCX);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  __return_storage_ptr__->window =
       ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
       Window<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t,duckdb::hugeint_t>
  ;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedModeFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = ModeFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, type);
	func.window = OP::template Window<STATE, INPUT_TYPE, INPUT_TYPE>;
	return func;
}